

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_verify_mlsag
              (secp256k1_context *ctx,uint8_t *preimage,size_t nCols,size_t nRows,uint8_t *pk,
              uint8_t *ki,uint8_t *pc,uint8_t *ps)

{
  uchar *puVar1;
  secp256k1_context *ctx_00;
  int iVar2;
  undefined4 extraout_EAX;
  uint8_t *puVar3;
  long lVar4;
  secp256k1_fe *rzr;
  uchar *puVar5;
  size_t len;
  uchar *pub;
  uchar *b32;
  secp256k1_sha256 *psVar6;
  uchar *b32_00;
  size_t sVar7;
  secp256k1_sha256 *psVar8;
  uchar *puVar9;
  uchar *pub_00;
  byte bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int overflow;
  int local_49c;
  uchar *local_498;
  uchar *local_490;
  uint8_t *local_488;
  uint8_t *local_480;
  uchar *local_478;
  size_t local_470;
  long local_468;
  long local_460;
  secp256k1_context *local_458;
  size_t clen;
  secp256k1_scalar clast;
  secp256k1_ge ge1;
  secp256k1_scalar ss;
  secp256k1_gej gej1;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  secp256k1_scalar cSig;
  uint8_t tmp [33];
  secp256k1_sha256 local_288;
  secp256k1_gej gej2;
  secp256k1_gej L;
  secp256k1_sha256 sha256_pre;
  secp256k1_gej R;
  
  bVar10 = 0;
  local_2f8 = (undefined1  [16])0x0;
  local_2e8 = (undefined1  [16])0x0;
  local_498 = (uchar *)nRows;
  local_470 = nCols;
  secp256k1_scalar_set_b32(&clast,pc,&overflow);
  local_49c = 1;
  if ((overflow == 0) &&
     ((CONCAT44(clast.d[3]._4_4_,(int)clast.d[3]) != 0 ||
      CONCAT44(clast.d[1]._4_4_,(int)clast.d[1]) != 0) ||
      (CONCAT44(clast.d[2]._4_4_,(int)clast.d[2]) != 0 ||
      CONCAT44(clast.d[0]._4_4_,(int)clast.d[0]) != 0))) {
    puVar1 = local_498 + -1;
    local_288.s[0] = 0x6a09e667;
    local_288.s[1] = 0xbb67ae85;
    local_288.s[2] = 0x3c6ef372;
    local_288.s[3] = 0xa54ff53a;
    local_288.s[4] = 0x510e527f;
    local_288.s[5] = 0x9b05688c;
    local_288.s[6] = 0x1f83d9ab;
    local_288.s[7] = 0x5be0cd19;
    local_288.bytes = 0;
    local_458 = ctx;
    secp256k1_sha256_write(&local_288,preimage,0x20);
    psVar6 = &local_288;
    psVar8 = &sha256_pre;
    for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
      *(undefined8 *)psVar8->s = *(undefined8 *)psVar6->s;
      psVar6 = (secp256k1_sha256 *)((long)psVar6 + (ulong)bVar10 * -0x10 + 8);
      psVar8 = (secp256k1_sha256 *)((long)psVar8 + (ulong)bVar10 * -0x10 + 8);
    }
    local_460 = local_470 << 5;
    local_468 = local_470 * 0x21;
    lVar4 = local_470 * (long)puVar1;
    local_478 = ps + lVar4 * 0x20;
    local_480 = pk + lVar4 * 0x21;
    sVar7 = 0;
    local_49c = 1;
    while( true ) {
      lVar4 = 0xd;
      puVar5 = (uchar *)0x1;
      if (sVar7 == local_470) break;
      psVar6 = &sha256_pre;
      psVar8 = &local_288;
      for (; puVar3 = ki, pub = pk, b32_00 = ps, lVar4 != 0; lVar4 = lVar4 + -1) {
        *(undefined8 *)psVar8->s = *(undefined8 *)psVar6->s;
        psVar6 = (secp256k1_sha256 *)((long)psVar6 + (ulong)bVar10 * -0x10 + 8);
        psVar8 = (secp256k1_sha256 *)((long)psVar8 + ((ulong)bVar10 * -2 + 1) * 8);
      }
      while( true ) {
        b32 = local_478;
        puVar9 = puVar1;
        pub_00 = local_480;
        if (local_498 == puVar5) break;
        local_490 = b32_00;
        local_488 = puVar3;
        secp256k1_scalar_set_b32(&ss,b32_00,&overflow);
        if (overflow != 0) {
          return local_49c;
        }
        if ((ss.d[3] == 0 && ss.d[1] == 0) && (ss.d[2] == 0 && ss.d[0] == 0)) {
          return local_49c;
        }
        iVar2 = secp256k1_eckey_pubkey_parse(&ge1,pub,0x21);
        ctx_00 = local_458;
        if (iVar2 == 0) {
          return local_49c;
        }
        gej1.infinity = ge1.infinity;
        gej1.x.n[4] = ge1.x.n[4];
        gej1.x.n[2] = ge1.x.n[2];
        gej1.x.n[3] = ge1.x.n[3];
        gej1.x.n[0] = ge1.x.n[0];
        gej1.x.n[1] = ge1.x.n[1];
        gej1.y.n[4] = ge1.y.n[4];
        gej1.y.n[2] = ge1.y.n[2];
        gej1.y.n[3] = ge1.y.n[3];
        gej1.y.n[0] = ge1.y.n[0];
        gej1.y.n[1] = ge1.y.n[1];
        gej1.z.n[0] = 1;
        gej1.z.n._24_16_ = ZEXT816(0);
        gej1.z.n._8_16_ = ZEXT816(0);
        secp256k1_ecmult(&local_458->ecmult_ctx,&L,&gej1,&clast,&ss);
        iVar2 = hash_to_curve(&ge1,pub,len);
        if (iVar2 != 0) {
          return local_49c;
        }
        gej1.infinity = ge1.infinity;
        gej1.x.n[4] = ge1.x.n[4];
        gej1.x.n[2] = ge1.x.n[2];
        gej1.x.n[3] = ge1.x.n[3];
        gej1.x.n[0] = ge1.x.n[0];
        gej1.x.n[1] = ge1.x.n[1];
        gej1.y.n[4] = ge1.y.n[4];
        gej1.y.n[2] = ge1.y.n[2];
        gej1.y.n[3] = ge1.y.n[3];
        gej1.y.n[0] = ge1.y.n[0];
        gej1.y.n[1] = ge1.y.n[1];
        gej1.z.n[0] = 1;
        gej1.z.n._24_16_ = ZEXT816(0);
        gej1.z.n._8_16_ = ZEXT816(0);
        secp256k1_ecmult(&ctx_00->ecmult_ctx,&gej1,&gej1,&ss,(secp256k1_scalar *)local_2f8);
        puVar3 = local_488;
        iVar2 = secp256k1_eckey_pubkey_parse(&ge1,local_488,0x21);
        if (iVar2 == 0) {
          return local_49c;
        }
        gej2.infinity = ge1.infinity;
        gej2.x.n[4] = ge1.x.n[4];
        gej2.x.n[2] = ge1.x.n[2];
        gej2.x.n[3] = ge1.x.n[3];
        gej2.x.n[0] = ge1.x.n[0];
        gej2.x.n[1] = ge1.x.n[1];
        gej2.y.n[0] = ge1.y.n[0];
        gej2.y.n[1] = ge1.y.n[1];
        gej2.y.n[4] = ge1.y.n[4];
        gej2.y.n[2] = ge1.y.n[2];
        gej2.y.n[3] = ge1.y.n[3];
        gej2.z.n[0] = 1;
        gej2.z.n[3] = 0;
        gej2.z.n[4] = 0;
        gej2.z.n[1] = 0;
        gej2.z.n[2] = 0;
        rzr = (secp256k1_fe *)&clast;
        secp256k1_ecmult(&ctx_00->ecmult_ctx,&gej2,&gej2,(secp256k1_scalar *)rzr,
                         (secp256k1_scalar *)local_2f8);
        secp256k1_gej_add_var(&R,&gej1,&gej2,rzr);
        secp256k1_sha256_write(&local_288,pub,0x21);
        secp256k1_ge_set_gej(&ge1,&L);
        secp256k1_eckey_pubkey_serialize(&ge1,tmp,&clen,1);
        secp256k1_sha256_write(&local_288,tmp,0x21);
        secp256k1_ge_set_gej(&ge1,&R);
        secp256k1_eckey_pubkey_serialize(&ge1,tmp,&clen,1);
        secp256k1_sha256_write(&local_288,tmp,0x21);
        puVar5 = puVar5 + 1;
        puVar3 = puVar3 + 0x21;
        pub = pub + local_468;
        b32_00 = local_490 + local_460;
      }
      while (puVar9 < local_498) {
        secp256k1_scalar_set_b32(&ss,b32,&overflow);
        if (overflow != 0) {
          return local_49c;
        }
        if ((ss.d[3] == 0 && ss.d[1] == 0) && (ss.d[2] == 0 && ss.d[0] == 0)) {
          return local_49c;
        }
        local_488 = puVar9;
        iVar2 = secp256k1_eckey_pubkey_parse(&ge1,pub_00,0x21);
        if (iVar2 == 0) {
          return local_49c;
        }
        gej1.infinity = ge1.infinity;
        gej1.x.n[4] = ge1.x.n[4];
        gej1.x.n[2] = ge1.x.n[2];
        gej1.x.n[3] = ge1.x.n[3];
        gej1.x.n[0] = ge1.x.n[0];
        gej1.x.n[1] = ge1.x.n[1];
        gej1.y.n[0] = ge1.y.n[0];
        gej1.y.n[1] = ge1.y.n[1];
        gej1.y.n[4] = ge1.y.n[4];
        gej1.y.n[2] = ge1.y.n[2];
        gej1.y.n[3] = ge1.y.n[3];
        gej1.z.n[0] = 1;
        gej1.z.n[3] = 0;
        gej1.z.n[4] = 0;
        gej1.z.n[1] = 0;
        gej1.z.n[2] = 0;
        local_490 = b32;
        secp256k1_ecmult(&local_458->ecmult_ctx,&L,&gej1,&clast,&ss);
        secp256k1_sha256_write(&local_288,pub_00,0x21);
        secp256k1_ge_set_gej(&ge1,&L);
        secp256k1_eckey_pubkey_serialize(&ge1,tmp,&clen,1);
        puVar5 = local_490;
        secp256k1_sha256_write(&local_288,tmp,0x21);
        b32 = puVar5 + local_460;
        pub_00 = pub_00 + local_468;
        puVar9 = local_488 + 1;
      }
      secp256k1_sha256_finalize(&local_288,tmp);
      secp256k1_scalar_set_b32(&clast,tmp,&overflow);
      if (overflow != 0) {
        return local_49c;
      }
      auVar11._0_4_ = -(uint)((int)clast.d[2] == 0 && (int)clast.d[0] == 0);
      auVar11._4_4_ = -(uint)(clast.d[2]._4_4_ == 0 && clast.d[0]._4_4_ == 0);
      auVar11._8_4_ = -(uint)((int)clast.d[3] == 0 && (int)clast.d[1] == 0);
      auVar11._12_4_ = -(uint)(clast.d[3]._4_4_ == 0 && clast.d[1]._4_4_ == 0);
      iVar2 = movmskps(extraout_EAX,auVar11);
      sVar7 = sVar7 + 1;
      ps = ps + 0x20;
      pk = pk + 0x21;
      local_478 = local_478 + 0x20;
      local_480 = local_480 + 0x21;
      if (iVar2 == 0xf) {
        return local_49c;
      }
    }
    secp256k1_scalar_negate(&cSig,&cSig);
    iVar2 = secp256k1_scalar_add((secp256k1_scalar *)local_2f8,&clast,&cSig);
    auVar12._0_4_ = -(uint)(local_2f8._0_4_ == 0 && local_2e8._0_4_ == 0);
    auVar12._4_4_ = -(uint)(local_2f8._4_4_ == 0 && local_2e8._4_4_ == 0);
    auVar12._8_4_ = -(uint)(local_2f8._8_4_ == 0 && local_2e8._8_4_ == 0);
    auVar12._12_4_ = -(uint)(local_2f8._12_4_ == 0 && local_2e8._12_4_ == 0);
    iVar2 = movmskps(iVar2,auVar12);
    local_49c = (uint)(iVar2 != 0xf) * 2;
  }
  return local_49c;
}

Assistant:

int secp256k1_verify_mlsag(const secp256k1_context *ctx,
    const uint8_t *preimage, size_t nCols, size_t nRows,
    const uint8_t *pk, const uint8_t *ki, const uint8_t *pc, const uint8_t *ps)
{
    secp256k1_sha256 sha256_m, sha256_pre;
    secp256k1_scalar zero, clast, cSig, ss;
    secp256k1_ge ge1;
    secp256k1_gej gej1, gej2, L, R;
    size_t dsRows = nRows-1; /* TODO: pass in dsRows explicitly? */
    uint8_t tmp[33];
    size_t i, k, clen;
    int overflow;

    secp256k1_scalar_set_int(&zero, 0);

    secp256k1_scalar_set_b32(&clast, pc, &overflow);
    if (overflow || secp256k1_scalar_is_zero(&clast)) {
        return 1;
    }

    cSig = clast;

    secp256k1_sha256_initialize(&sha256_m);
    secp256k1_sha256_write(&sha256_m, preimage, 32);
    sha256_pre = sha256_m;

    for (i = 0; i < nCols; ++i) {
        sha256_m = sha256_pre; /* set to after preimage hashed */

        for (k = 0; k < dsRows; ++k) {
            /* L = G * ss + pk[k][i] * clast */
            secp256k1_scalar_set_b32(&ss, &ps[(i + k*nCols)*32], &overflow);
            if (overflow || secp256k1_scalar_is_zero(&ss)) {
                return 1;
            }
            if (!secp256k1_eckey_pubkey_parse(&ge1, &pk[(i + k*nCols)*33], 33)) {
                return 1;
            }
            secp256k1_gej_set_ge(&gej1, &ge1);
            secp256k1_ecmult(&ctx->ecmult_ctx, &L, &gej1, &clast, &ss);

            /* R = H(pk[k][i]) * ss + ki[k] * clast */
            if (0 != hash_to_curve(&ge1, &pk[(i + k*nCols)*33], 33)) { /* H(pk[k][i]) */
                return 1;
            }
            secp256k1_gej_set_ge(&gej1, &ge1);
            secp256k1_ecmult(&ctx->ecmult_ctx, &gej1, &gej1, &ss, &zero); /* gej1 = H(pk[k][i]) * ss */

            if (!secp256k1_eckey_pubkey_parse(&ge1, &ki[k * 33], 33)) {
                return 1;
            }
            secp256k1_gej_set_ge(&gej2, &ge1);
            secp256k1_ecmult(&ctx->ecmult_ctx, &gej2, &gej2, &clast, &zero); /* gej2 = ki[k] * clast */

            secp256k1_gej_add_var(&R, &gej1, &gej2, NULL);  /* R =  gej1 + gej2 */

            secp256k1_sha256_write(&sha256_m, &pk[(i + k*nCols)*33], 33); /* pk[k][i] */
            secp256k1_ge_set_gej(&ge1, &L);
            secp256k1_eckey_pubkey_serialize(&ge1, tmp, &clen, 1);
            secp256k1_sha256_write(&sha256_m, tmp, 33); /* L */
            secp256k1_ge_set_gej(&ge1, &R);
            secp256k1_eckey_pubkey_serialize(&ge1, tmp, &clen, 1);
            secp256k1_sha256_write(&sha256_m, tmp, 33); /* R */
        }

        for (k = dsRows; k < nRows; ++k) {
            /* L = G * ss + pk[k][i] * clast */
            secp256k1_scalar_set_b32(&ss, &ps[(i + k*nCols)*32], &overflow);
            if (overflow || secp256k1_scalar_is_zero(&ss)) {
                return 1;
            }
            if (!secp256k1_eckey_pubkey_parse(&ge1, &pk[(i + k*nCols)*33], 33)) {
                return 1;
            }

            secp256k1_gej_set_ge(&gej1, &ge1);
            secp256k1_ecmult(&ctx->ecmult_ctx, &L, &gej1, &clast, &ss);

            secp256k1_sha256_write(&sha256_m, &pk[(i + k*nCols)*33], 33); /* pk[k][i] */
            secp256k1_ge_set_gej(&ge1, &L);
            secp256k1_eckey_pubkey_serialize(&ge1, tmp, &clen, 1);
            secp256k1_sha256_write(&sha256_m, tmp, 33); /* L */
        };

        secp256k1_sha256_finalize(&sha256_m, tmp);
        secp256k1_scalar_set_b32(&clast, tmp, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&clast)) {
            return 1;
        }
    }

    secp256k1_scalar_negate(&cSig, &cSig);
    secp256k1_scalar_add(&zero, &clast, &cSig);

    return secp256k1_scalar_is_zero(&zero) ? 0 : 2; /* return 0 on success, 2 on failure */
}